

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg const_num(FuncState *fs,ExpDesc *e)

{
  TValue *pTVar1;
  TValue TVar2;
  long in_RDI;
  TValue *o;
  lua_State *L;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  BCReg BVar3;
  
  pTVar1 = lj_tab_set(L,(GCtab *)&o->field_2,
                      (cTValue *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if ((pTVar1->field_2).it == 0) {
    BVar3 = (pTVar1->u32).lo;
  }
  else {
    TVar2.field_2.it = 0;
    TVar2.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
         *(uint *)(in_RDI + 0x3c);
    *pTVar1 = TVar2;
    BVar3 = *(BCReg *)(in_RDI + 0x3c);
    *(BCReg *)(in_RDI + 0x3c) = BVar3 + 1;
  }
  return BVar3;
}

Assistant:

static BCReg const_num(FuncState *fs, ExpDesc *e)
{
  lua_State *L = fs->L;
  TValue *o;
  lj_assertFS(expr_isnumk(e), "bad usage");
  o = lj_tab_set(L, fs->kt, &e->u.nval);
  if (tvhaskslot(o))
    return tvkslot(o);
  o->u64 = fs->nkn;
  return fs->nkn++;
}